

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O0

void __thiscall HighsSplitDeque::growShared(HighsSplitDeque *this)

{
  element_type *peVar1;
  uint *puVar2;
  HighsSplitDeque *localDeque;
  WorkerBunk *this_00;
  long in_RDI;
  bool bVar3;
  uint64_t xorMask;
  uint32_t newSplit;
  bool splitRq;
  int haveJobs;
  memory_order __b;
  memory_order in_stack_ffffffffffffff04;
  atomic<bool> *in_stack_ffffffffffffff08;
  memory_order in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  atomic<bool> *in_stack_ffffffffffffff18;
  WorkerBunk *pWVar4;
  uint local_58;
  uint local_54;
  bool local_4d;
  int local_4c;
  int local_3c;
  memory_order local_38;
  int local_34;
  element_type *local_30;
  WorkerBunk *local_28;
  HighsSplitDeque *local_20;
  undefined4 local_14;
  HighsSplitDeque *local_10;
  ulong *local_8;
  
  peVar1 = std::
           __shared_ptr_access<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4be5e4);
  local_34 = 0;
  local_30 = peVar1;
  local_38 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_34 - 1U < 2) {
    local_3c = (peVar1->haveJobs).super___atomic_base<int>._M_i;
  }
  else if (local_34 == 5) {
    local_3c = (peVar1->haveJobs).super___atomic_base<int>._M_i;
  }
  else {
    local_3c = (peVar1->haveJobs).super___atomic_base<int>._M_i;
  }
  local_4c = local_3c;
  local_4d = false;
  if ((local_3c != *(int *)(in_RDI + 0x28)) ||
     (local_4d = std::atomic<bool>::load(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04),
     local_4d)) {
    local_58 = 0x2000;
    puVar2 = std::min<unsigned_int>(&local_58,(uint *)(in_RDI + 0x20));
    local_54 = *puVar2;
    localDeque = (HighsSplitDeque *)(ulong)(*(uint *)(in_RDI + 0x24) ^ local_54);
    local_8 = (ulong *)(in_RDI + 0x90);
    local_14 = 3;
    pWVar4 = (WorkerBunk *)*local_8;
    do {
      LOCK();
      this_00 = (WorkerBunk *)*local_8;
      bVar3 = pWVar4 == this_00;
      if (bVar3) {
        *local_8 = (ulong)pWVar4 ^ (ulong)localDeque;
        this_00 = pWVar4;
      }
      UNLOCK();
      pWVar4 = this_00;
    } while (!bVar3);
    *(uint *)(in_RDI + 0x24) = local_54;
    local_28 = this_00;
    local_20 = localDeque;
    local_10 = localDeque;
    if ((local_4d & 1U) == 0) {
      std::
      __shared_ptr_access<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4be9ad);
      WorkerBunk::publishWork(this_00,localDeque);
    }
    else {
      std::atomic<bool>::store
                (in_stack_ffffffffffffff18,(bool)in_stack_ffffffffffffff17,in_stack_ffffffffffffff10
                );
    }
  }
  return;
}

Assistant:

void growShared() {
    int haveJobs =
        ownerData.workerBunk->haveJobs.load(std::memory_order_relaxed);
    bool splitRq = false;
    uint32_t newSplit;
    if (haveJobs == ownerData.numWorkers) {
      splitRq = splitRequest.load(std::memory_order_relaxed);
      if (!splitRq) return;
    }

    newSplit = std::min(uint32_t{kTaskArraySize}, ownerData.head);

    assert(newSplit > ownerData.splitCopy);

    // we want to replace the old split point with the new splitPoint
    // but not alter the upper 32 bits of tail.
    // Hence with xor we can xor or the copy of the current split point
    // to set the lower bits to zero and then xor the bits of the new split
    // point to the lower bits that are then zero. First doing the xor of the
    // old and new split point and then doing the xor with the stealerData
    // will not alter the result. Also the upper 32 bits of the xor mask are
    // zero and will therefore not alter the value of tail.
    uint64_t xorMask = ownerData.splitCopy ^ newSplit;
    // since we publish the task data here, we need to use
    // std::memory_order_release which ensures all writes to set up the task
    // are done
    assert((xorMask >> 32) == 0);

    stealerData.ts.fetch_xor(xorMask, std::memory_order_release);
    ownerData.splitCopy = newSplit;
    if (splitRq)
      splitRequest.store(false, std::memory_order_relaxed);
    else
      ownerData.workerBunk->publishWork(this);
  }